

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-read.c
# Opt level: O0

size_t hd_skip(hd_context *ctx,hd_stream *stm,size_t len)

{
  size_t sVar1;
  size_t local_38;
  size_t total;
  size_t l;
  size_t count;
  size_t len_local;
  hd_stream *stm_local;
  hd_context *ctx_local;
  
  local_38 = 0;
  count = len;
  while( true ) {
    if (count == 0) {
      return local_38;
    }
    total = count;
    if (0x1000 < count) {
      total = 0x1000;
    }
    sVar1 = hd_read(ctx,stm,skip_buf,total);
    local_38 = sVar1 + local_38;
    if (sVar1 < total) break;
    count = count - sVar1;
  }
  return local_38;
}

Assistant:

size_t hd_skip(hd_context *ctx, hd_stream *stm, size_t len)
{
    size_t count, l, total = 0;

    while (len)
    {
        l = len;
        if (l > sizeof(skip_buf))
            l = sizeof(skip_buf);
        count = hd_read(ctx, stm, skip_buf, l);
        total += count;
        if (count < l)
            break;
        len -= count;
    }
    return total;
}